

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<short,true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  short sVar1;
  data_ptr_t pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  RLEScanState<short> *scan_state;
  idx_t iVar12;
  idx_t iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  short *data_pointer;
  rle_count_t *index_pointer;
  ulong uVar18;
  undefined1 in_XMM2 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar50;
  int iVar53;
  undefined1 auVar51 [16];
  int iVar54;
  undefined1 auVar52 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  
  scan_state = (RLEScanState<short> *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(scan_state->handle).node);
  pdVar2 = ((scan_state->handle).node.ptr)->buffer;
  data_pointer = (short *)(pdVar2 + segment->offset + 8);
  index_pointer = (rle_count_t *)(pdVar2 + (ulong)scan_state->rle_count_offset + segment->offset);
  if ((scan_count == 0x800) &&
     (0x7ff < (ulong)index_pointer[scan_state->entry_pos] - scan_state->position_in_entry)) {
    RLEScanConstant<short>(scan_state,index_pointer,data_pointer,0x800,result);
    return;
  }
  pdVar2 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar24 = _DAT_01da0bd0;
  auVar23 = _DAT_01da0bc0;
  auVar11 = _DAT_01d9fb10;
  auVar22 = _DAT_01d9fb00;
  uVar18 = scan_count + result_offset;
  if (result_offset < uVar18) {
    iVar13 = scan_state->entry_pos;
    iVar12 = scan_state->position_in_entry;
    auVar27._8_4_ = 0xffffffff;
    auVar27._0_8_ = 0xffffffffffffffff;
    auVar27._12_4_ = 0xffffffff;
    do {
      uVar17 = index_pointer[iVar13] - iVar12;
      uVar16 = uVar18 - result_offset;
      sVar1 = data_pointer[iVar13];
      if (uVar16 < uVar17) {
        if (uVar18 != result_offset) {
          lVar14 = uVar16 + (uVar16 == 0);
          lVar15 = lVar14 + -1;
          auVar55._8_4_ = (int)lVar15;
          auVar55._0_8_ = lVar15;
          auVar55._12_4_ = (int)((ulong)lVar15 >> 0x20);
          uVar18 = 0;
          auVar55 = auVar55 ^ auVar11;
          auVar56._8_4_ = 0xffffffff;
          auVar56._0_8_ = 0xffffffffffffffff;
          auVar56._12_4_ = 0xffffffff;
          auVar22 = _DAT_01da0bb0;
          auVar23 = _DAT_01da0bc0;
          auVar24 = _DAT_01da0bd0;
          auVar40 = _DAT_01d9fb00;
          do {
            auVar27 = auVar40 ^ auVar11;
            iVar50 = auVar55._0_4_;
            iVar49 = -(uint)(iVar50 < auVar27._0_4_);
            iVar20 = auVar55._4_4_;
            auVar28._4_4_ = -(uint)(iVar20 < auVar27._4_4_);
            iVar54 = auVar55._8_4_;
            iVar53 = -(uint)(iVar54 < auVar27._8_4_);
            iVar21 = auVar55._12_4_;
            auVar28._12_4_ = -(uint)(iVar21 < auVar27._12_4_);
            auVar34._4_4_ = iVar49;
            auVar34._0_4_ = iVar49;
            auVar34._8_4_ = iVar53;
            auVar34._12_4_ = iVar53;
            auVar39 = pshuflw(in_XMM11,auVar34,0xe8);
            auVar44._4_4_ = -(uint)(auVar27._4_4_ == iVar20);
            auVar44._12_4_ = -(uint)(auVar27._12_4_ == iVar21);
            auVar44._0_4_ = auVar44._4_4_;
            auVar44._8_4_ = auVar44._12_4_;
            auVar48 = pshuflw(in_XMM12,auVar44,0xe8);
            auVar28._0_4_ = auVar28._4_4_;
            auVar28._8_4_ = auVar28._12_4_;
            auVar27 = pshuflw(auVar39,auVar28,0xe8);
            auVar27 = (auVar27 | auVar48 & auVar39) ^ auVar56;
            auVar27 = packssdw(auVar27,auVar27);
            if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2) = sVar1;
            }
            auVar28 = auVar44 & auVar34 | auVar28;
            auVar27 = packssdw(auVar28,auVar28);
            auVar27 = packssdw(auVar27 ^ auVar56,auVar27 ^ auVar56);
            if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2 + 2) = sVar1;
            }
            auVar27 = auVar24 ^ auVar11;
            iVar49 = -(uint)(iVar50 < auVar27._0_4_);
            auVar37._4_4_ = -(uint)(iVar20 < auVar27._4_4_);
            iVar53 = -(uint)(iVar54 < auVar27._8_4_);
            auVar37._12_4_ = -(uint)(iVar21 < auVar27._12_4_);
            auVar29._4_4_ = iVar49;
            auVar29._0_4_ = iVar49;
            auVar29._8_4_ = iVar53;
            auVar29._12_4_ = iVar53;
            auVar33._4_4_ = -(uint)(auVar27._4_4_ == iVar20);
            auVar33._12_4_ = -(uint)(auVar27._12_4_ == iVar21);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar27 = auVar33 & auVar29 | auVar37;
            auVar27 = packssdw(auVar27,auVar27);
            auVar27 = packssdw(auVar27 ^ auVar56,auVar27 ^ auVar56);
            if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2 + 4) = sVar1;
            }
            auVar44 = pshufhw(auVar29,auVar29,0x84);
            auVar34 = pshufhw(auVar33,auVar33,0x84);
            auVar28 = pshufhw(auVar44,auVar37,0x84);
            auVar44 = (auVar28 | auVar34 & auVar44) ^ auVar56;
            auVar44 = packssdw(auVar44,auVar44);
            if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2 + 6) = sVar1;
            }
            auVar44 = auVar23 ^ auVar11;
            iVar49 = -(uint)(iVar50 < auVar44._0_4_);
            auVar31._4_4_ = -(uint)(iVar20 < auVar44._4_4_);
            iVar53 = -(uint)(iVar54 < auVar44._8_4_);
            auVar31._12_4_ = -(uint)(iVar21 < auVar44._12_4_);
            auVar35._4_4_ = iVar49;
            auVar35._0_4_ = iVar49;
            auVar35._8_4_ = iVar53;
            auVar35._12_4_ = iVar53;
            auVar27 = pshuflw(auVar27,auVar35,0xe8);
            auVar30._4_4_ = -(uint)(auVar44._4_4_ == iVar20);
            auVar30._12_4_ = -(uint)(auVar44._12_4_ == iVar21);
            auVar30._0_4_ = auVar30._4_4_;
            auVar30._8_4_ = auVar30._12_4_;
            in_XMM12 = pshuflw(auVar48 & auVar39,auVar30,0xe8);
            in_XMM12 = in_XMM12 & auVar27;
            auVar31._0_4_ = auVar31._4_4_;
            auVar31._8_4_ = auVar31._12_4_;
            auVar27 = pshuflw(auVar27,auVar31,0xe8);
            auVar27 = (auVar27 | in_XMM12) ^ auVar56;
            auVar27 = packssdw(auVar27,auVar27);
            if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2 + 8) = sVar1;
            }
            auVar31 = auVar30 & auVar35 | auVar31;
            auVar27 = packssdw(auVar31,auVar31);
            auVar27 = packssdw(auVar27 ^ auVar56,auVar27 ^ auVar56);
            if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2 + 10) = sVar1;
            }
            auVar27 = auVar22 ^ auVar11;
            iVar50 = -(uint)(iVar50 < auVar27._0_4_);
            auVar38._4_4_ = -(uint)(iVar20 < auVar27._4_4_);
            iVar54 = -(uint)(iVar54 < auVar27._8_4_);
            auVar38._12_4_ = -(uint)(iVar21 < auVar27._12_4_);
            auVar39._4_4_ = iVar50;
            auVar39._0_4_ = iVar50;
            auVar39._8_4_ = iVar54;
            auVar39._12_4_ = iVar54;
            auVar48._4_4_ = -(uint)(auVar27._4_4_ == iVar20);
            auVar48._12_4_ = -(uint)(auVar27._12_4_ == iVar21);
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar27 = auVar48 & auVar39 | auVar38;
            auVar27 = packssdw(auVar27,auVar27);
            in_XMM11 = packssdw(auVar27 ^ auVar56,auVar27 ^ auVar56);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2 + 0xc) = sVar1;
            }
            auVar27 = pshufhw(auVar39,auVar39,0x84);
            auVar28 = pshufhw(auVar48,auVar48,0x84);
            auVar44 = pshufhw(auVar27,auVar38,0x84);
            auVar27 = (auVar44 | auVar28 & auVar27) ^ auVar56;
            auVar27 = packssdw(auVar27,auVar27);
            if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(pdVar2 + uVar18 * 2 + result_offset * 2 + 0xe) = sVar1;
            }
            uVar18 = uVar18 + 8;
            lVar15 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + 8;
            auVar40._8_8_ = lVar15 + 8;
            lVar15 = auVar24._8_8_;
            auVar24._0_8_ = auVar24._0_8_ + 8;
            auVar24._8_8_ = lVar15 + 8;
            lVar15 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 8;
            auVar23._8_8_ = lVar15 + 8;
            lVar15 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 8;
            auVar22._8_8_ = lVar15 + 8;
          } while ((lVar14 + 7U & 0xfffffffffffffff8) != uVar18);
        }
        scan_state->position_in_entry = iVar12 + uVar16;
        return;
      }
      if (index_pointer[iVar13] != iVar12) {
        lVar14 = uVar17 - 1;
        auVar25._8_4_ = (int)lVar14;
        auVar25._0_8_ = lVar14;
        auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
        lVar14 = result_offset * 2;
        auVar25 = auVar25 ^ auVar11;
        uVar16 = 0;
        auVar26 = auVar22;
        auVar32 = auVar24;
        auVar36 = auVar23;
        in_XMM11 = _DAT_01da0bb0;
        do {
          auVar40 = auVar26 ^ auVar11;
          iVar50 = auVar25._0_4_;
          iVar49 = -(uint)(iVar50 < auVar40._0_4_);
          iVar20 = auVar25._4_4_;
          auVar42._4_4_ = -(uint)(iVar20 < auVar40._4_4_);
          iVar54 = auVar25._8_4_;
          iVar53 = -(uint)(iVar54 < auVar40._8_4_);
          iVar21 = auVar25._12_4_;
          auVar42._12_4_ = -(uint)(iVar21 < auVar40._12_4_);
          auVar3._4_4_ = iVar49;
          auVar3._0_4_ = iVar49;
          auVar3._8_4_ = iVar53;
          auVar3._12_4_ = iVar53;
          auVar55 = pshuflw(in_XMM15,auVar3,0xe8);
          auVar41._4_4_ = -(uint)(auVar40._4_4_ == iVar20);
          auVar41._12_4_ = -(uint)(auVar40._12_4_ == iVar21);
          auVar41._0_4_ = auVar41._4_4_;
          auVar41._8_4_ = auVar41._12_4_;
          auVar40 = pshuflw(in_XMM2,auVar41,0xe8);
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar56 = pshuflw(auVar55,auVar42,0xe8);
          auVar40 = (auVar56 | auVar40 & auVar55) ^ auVar27;
          auVar40 = packssdw(auVar40,auVar40);
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14) = sVar1;
          }
          auVar4._4_4_ = iVar49;
          auVar4._0_4_ = iVar49;
          auVar4._8_4_ = iVar53;
          auVar4._12_4_ = iVar53;
          auVar42 = auVar41 & auVar4 | auVar42;
          auVar55 = packssdw(auVar42,auVar42);
          auVar55 = packssdw(auVar55 ^ auVar27,auVar55 ^ auVar27);
          if ((auVar55._0_4_ >> 0x10 & 1) != 0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14 + 2) = sVar1;
          }
          auVar55 = auVar32 ^ auVar11;
          iVar49 = -(uint)(iVar50 < auVar55._0_4_);
          auVar51._4_4_ = -(uint)(iVar20 < auVar55._4_4_);
          iVar53 = -(uint)(iVar54 < auVar55._8_4_);
          auVar51._12_4_ = -(uint)(iVar21 < auVar55._12_4_);
          auVar43._4_4_ = iVar49;
          auVar43._0_4_ = iVar49;
          auVar43._8_4_ = iVar53;
          auVar43._12_4_ = iVar53;
          iVar49 = -(uint)(auVar55._4_4_ == iVar20);
          iVar53 = -(uint)(auVar55._12_4_ == iVar21);
          auVar5._4_4_ = iVar49;
          auVar5._0_4_ = iVar49;
          auVar5._8_4_ = iVar53;
          auVar5._12_4_ = iVar53;
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar55 = auVar5 & auVar43 | auVar51;
          auVar55 = packssdw(auVar55,auVar55);
          auVar55 = packssdw(auVar55 ^ auVar27,auVar55 ^ auVar27);
          if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14 + 4) = sVar1;
          }
          auVar55 = pshufhw(auVar55,auVar43,0x84);
          auVar6._4_4_ = iVar49;
          auVar6._0_4_ = iVar49;
          auVar6._8_4_ = iVar53;
          auVar6._12_4_ = iVar53;
          auVar44 = pshufhw(auVar43,auVar6,0x84);
          auVar56 = pshufhw(auVar55,auVar51,0x84);
          auVar55 = (auVar56 | auVar44 & auVar55) ^ auVar27;
          auVar55 = packssdw(auVar55,auVar55);
          if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14 + 6) = sVar1;
          }
          auVar55 = auVar36 ^ auVar11;
          iVar49 = -(uint)(iVar50 < auVar55._0_4_);
          auVar46._4_4_ = -(uint)(iVar20 < auVar55._4_4_);
          iVar53 = -(uint)(iVar54 < auVar55._8_4_);
          auVar46._12_4_ = -(uint)(iVar21 < auVar55._12_4_);
          auVar7._4_4_ = iVar49;
          auVar7._0_4_ = iVar49;
          auVar7._8_4_ = iVar53;
          auVar7._12_4_ = iVar53;
          auVar56 = pshuflw(auVar40,auVar7,0xe8);
          auVar19._0_4_ = -(uint)(auVar55._0_4_ == iVar50);
          auVar19._4_4_ = -(uint)(auVar55._4_4_ == iVar20);
          auVar19._8_4_ = -(uint)(auVar55._8_4_ == iVar54);
          auVar19._12_4_ = -(uint)(auVar55._12_4_ == iVar21);
          auVar45._4_4_ = auVar19._4_4_;
          auVar45._0_4_ = auVar19._4_4_;
          auVar45._8_4_ = auVar19._12_4_;
          auVar45._12_4_ = auVar19._12_4_;
          auVar40 = pshuflw(auVar19,auVar45,0xe8);
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar55 = pshuflw(auVar56,auVar46,0xe8);
          in_XMM15 = (auVar55 | auVar40 & auVar56) ^ auVar27;
          auVar40 = packssdw(auVar40 & auVar56,in_XMM15);
          if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14 + 8) = sVar1;
          }
          auVar8._4_4_ = iVar49;
          auVar8._0_4_ = iVar49;
          auVar8._8_4_ = iVar53;
          auVar8._12_4_ = iVar53;
          auVar46 = auVar45 & auVar8 | auVar46;
          auVar55 = packssdw(auVar46,auVar46);
          auVar40 = packssdw(auVar40,auVar55 ^ auVar27);
          if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14 + 10) = sVar1;
          }
          auVar40 = in_XMM11 ^ auVar11;
          iVar50 = -(uint)(iVar50 < auVar40._0_4_);
          auVar52._4_4_ = -(uint)(iVar20 < auVar40._4_4_);
          iVar54 = -(uint)(iVar54 < auVar40._8_4_);
          auVar52._12_4_ = -(uint)(iVar21 < auVar40._12_4_);
          auVar47._4_4_ = iVar50;
          auVar47._0_4_ = iVar50;
          auVar47._8_4_ = iVar54;
          auVar47._12_4_ = iVar54;
          iVar50 = -(uint)(auVar40._4_4_ == iVar20);
          iVar20 = -(uint)(auVar40._12_4_ == iVar21);
          auVar9._4_4_ = iVar50;
          auVar9._0_4_ = iVar50;
          auVar9._8_4_ = iVar20;
          auVar9._12_4_ = iVar20;
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          auVar40 = auVar9 & auVar47 | auVar52;
          auVar40 = packssdw(auVar40,auVar40);
          auVar40 = packssdw(auVar40 ^ auVar27,auVar40 ^ auVar27);
          if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14 + 0xc) = sVar1;
          }
          auVar40 = pshufhw(auVar40,auVar47,0x84);
          auVar10._4_4_ = iVar50;
          auVar10._0_4_ = iVar50;
          auVar10._8_4_ = iVar20;
          auVar10._12_4_ = iVar20;
          in_XMM12 = pshufhw(auVar47,auVar10,0x84);
          in_XMM12 = in_XMM12 & auVar40;
          auVar40 = pshufhw(auVar40,auVar52,0x84);
          auVar40 = (auVar40 | in_XMM12) ^ auVar27;
          in_XMM2 = packssdw(auVar40,auVar40);
          if ((in_XMM2 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)(pdVar2 + uVar16 * 2 + lVar14 + 0xe) = sVar1;
          }
          uVar16 = uVar16 + 8;
          lVar15 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 8;
          auVar26._8_8_ = lVar15 + 8;
          lVar15 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 8;
          auVar32._8_8_ = lVar15 + 8;
          lVar15 = auVar36._8_8_;
          auVar36._0_8_ = auVar36._0_8_ + 8;
          auVar36._8_8_ = lVar15 + 8;
          lVar15 = in_XMM11._8_8_;
          in_XMM11._0_8_ = in_XMM11._0_8_ + 8;
          in_XMM11._8_8_ = lVar15 + 8;
        } while ((uVar17 + 7 & 0xfffffffffffffff8) != uVar16);
      }
      result_offset = result_offset + uVar17;
      iVar13 = iVar13 + 1;
      scan_state->entry_pos = iVar13;
      scan_state->position_in_entry = 0;
      iVar12 = 0;
    } while (result_offset < uVar18);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}